

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_common.c
# Opt level: O0

uint64_t lzma_delta_coder_memusage(void *options)

{
  lzma_options_delta *opt;
  void *options_local;
  
  if ((((options == (void *)0x0) || (*options != 0)) || (*(int *)((long)options + 4) == 0)) ||
     (0x100 < *(uint *)((long)options + 4))) {
    options_local = (void *)0xffffffffffffffff;
  }
  else {
    options_local = (void *)0x158;
  }
  return (uint64_t)options_local;
}

Assistant:

extern uint64_t
lzma_delta_coder_memusage(const void *options)
{
	const lzma_options_delta *opt = options;

	if (opt == NULL || opt->type != LZMA_DELTA_TYPE_BYTE
			|| opt->dist < LZMA_DELTA_DIST_MIN
			|| opt->dist > LZMA_DELTA_DIST_MAX)
		return UINT64_MAX;

	return sizeof(lzma_delta_coder);
}